

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O0

UINT8 nes_apu_read(void *chip,uint8 offset)

{
  byte local_29;
  uint8 readval;
  nesapu_state *info;
  uint8 offset_local;
  void *chip_local;
  
  if (offset == '\x15') {
    local_29 = 0 < *(int *)((long)chip + 0xc);
    if (0 < *(int *)((long)chip + 0x34)) {
      local_29 = local_29 | 2;
    }
    if (0 < *(int *)((long)chip + 100)) {
      local_29 = local_29 | 4;
    }
    if (0 < *(int *)((long)chip + 0x88)) {
      local_29 = local_29 | 8;
    }
    if ((*(byte *)((long)chip + 0xb5) & 1) != 0) {
      local_29 = local_29 | 0x10;
    }
    if (*(char *)((long)chip + 0xf2) != '\0') {
      local_29 = local_29 | 0x40;
    }
    if ((*(byte *)((long)chip + 0xb6) & 1) != 0) {
      local_29 = local_29 | 0x80;
    }
    *(undefined1 *)((long)chip + 0xf2) = 0;
    chip_local._7_1_ = local_29;
  }
  else {
    chip_local._7_1_ = *(byte *)((long)chip + (ulong)offset + 0xd0);
  }
  return chip_local._7_1_;
}

Assistant:

uint8 nes_apu_read(void* chip, uint8 offset)
{
	nesapu_state *info = (nesapu_state*)chip;
	
	if (offset == 0x15) /*FIXED* Address $4015 has different behaviour*/
	{
		uint8 readval = 0;
		if (info->APU.squ[0].vbl_length > 0)
			readval |= 0x01;

		if (info->APU.squ[1].vbl_length > 0)
			readval |= 0x02;

		if (info->APU.tri.vbl_length > 0)
			readval |= 0x04;

		if (info->APU.noi.vbl_length > 0)
			readval |= 0x08;

		if (info->APU.dpcm.enabled)
			readval |= 0x10;

		if (info->APU.frame_irq_occurred)
			readval |= 0x40;

		if (info->APU.dpcm.irq_occurred)
			readval |= 0x80;

		info->APU.frame_irq_occurred = false;
		//if (!info->APU.dpcm.irq_occurred)
		//	info->irq_handler(false);

		return readval;
	}
	else
		return info->APU.regs[offset];
}